

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NewtFns.c
# Opt level: O0

newtRef NcLexicalLookup(newtRefArg start,newtRef name)

{
  _Bool _Var1;
  newtRef nVar2;
  newtRefArg local_28;
  newtRefVar current;
  newtRef name_local;
  newtRefArg start_local;
  
  local_28 = start;
  while( true ) {
    _Var1 = NewtRefIsNotNIL(local_28);
    if (!_Var1) {
      return 0xfff2;
    }
    nVar2 = NcResolveMagicPointer(local_28);
    _Var1 = NewtRefIsMagicPointer(nVar2);
    if (_Var1) break;
    _Var1 = NewtHasSlot(nVar2,name);
    if (_Var1) {
      nVar2 = NsGetSlot(2,nVar2,name);
      return nVar2;
    }
    local_28 = NsGetSlot(2,nVar2,newt_sym._nextArgFrame);
  }
  return 0xfff2;
}

Assistant:

newtRef NcLexicalLookup(newtRefArg start, newtRef name)
{
    newtRefVar	current = start;
    
    while (NewtRefIsNotNIL(current))
    {
        current = NcResolveMagicPointer(current);
        
        if (NewtRefIsMagicPointer(current))
            return kNewtRefUnbind;
        
        if (NewtHasSlot(current, name))
            return NcGetSlot(current, name);
        
        current = NcGetSlot(current, NSSYM0(_nextArgFrame));
    }
    
    return kNewtRefUnbind;
}